

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme_examples.c
# Opt level: O1

void create_monitor_with_helpers_should_create_a_monitor(void)

{
  cJSON *pcVar1;
  cJSON *object;
  cJSON *pcVar2;
  cJSON *object_00;
  cJSON *pcVar3;
  uchar *actual;
  internal_hooks *hooks;
  long lVar4;
  
  object = (cJSON *)(*global_hooks.allocate)(0x40);
  if (object != (cJSON *)0x0) {
    object->child = (cJSON *)0x0;
    *(undefined8 *)&object->type = 0;
    object->valuedouble = 0.0;
    object->string = (char *)0x0;
    object->valuestring = (char *)0x0;
    *(undefined8 *)&object->valueint = 0;
    object->next = (cJSON *)0x0;
    object->prev = (cJSON *)0x0;
    object->type = 0x40;
  }
  pcVar2 = cJSON_AddStringToObject(object,"name","Awesome 4K");
  if (pcVar2 != (cJSON *)0x0) {
    pcVar2 = cJSON_AddArrayToObject(object,"resolutions");
    if (pcVar2 != (cJSON *)0x0) {
      lVar4 = 0;
      do {
        object_00 = (cJSON *)(*global_hooks.allocate)(0x40);
        if (object_00 != (cJSON *)0x0) {
          object_00->child = (cJSON *)0x0;
          *(undefined8 *)&object_00->type = 0;
          object_00->valuedouble = 0.0;
          object_00->string = (char *)0x0;
          object_00->valuestring = (char *)0x0;
          *(undefined8 *)&object_00->valueint = 0;
          object_00->next = (cJSON *)0x0;
          object_00->prev = (cJSON *)0x0;
          object_00->type = 0x40;
        }
        pcVar3 = cJSON_AddNumberToObject(object_00,"width",(double)(uint)(&DAT_001090c0)[lVar4 * 2])
        ;
        if (pcVar3 == (cJSON *)0x0) goto LAB_00105f4d;
        pcVar3 = cJSON_AddNumberToObject
                           (object_00,"height",(double)(uint)(&DAT_001090c4)[lVar4 * 2]);
        if (pcVar3 == (cJSON *)0x0) goto LAB_00105f4d;
        if (pcVar2 != object_00 && object_00 != (cJSON *)0x0) {
          pcVar3 = pcVar2->child;
          if (pcVar3 == (cJSON *)0x0) {
            pcVar2->child = object_00;
            object_00->prev = object_00;
            object_00->next = (cJSON *)0x0;
          }
          else {
            pcVar1 = pcVar3->prev;
            if (pcVar1 != (cJSON *)0x0) {
              pcVar1->next = object_00;
              object_00->prev = pcVar1;
              pcVar3->prev = object_00;
            }
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      actual = print(object,1,hooks);
      if (actual != (uchar *)0x0) goto LAB_00105f50;
      create_monitor_with_helpers_should_create_a_monitor_cold_1();
    }
  }
LAB_00105f4d:
  actual = (uchar *)0x0;
LAB_00105f50:
  cJSON_Delete(object);
  UnityAssertEqualString
            ("{\n\t\"name\":\t\"Awesome 4K\",\n\t\"resolutions\":\t[{\n\t\t\t\"width\":\t1280,\n\t\t\t\"height\":\t720\n\t\t}, {\n\t\t\t\"width\":\t1920,\n\t\t\t\"height\":\t1080\n\t\t}, {\n\t\t\t\"width\":\t3840,\n\t\t\t\"height\":\t2160\n\t\t}]\n}"
             ,(char *)actual,(char *)0x0,0xe6);
  free(actual);
  return;
}

Assistant:

static void create_monitor_with_helpers_should_create_a_monitor(void)
{
    char *monitor = create_monitor_with_helpers();

    TEST_ASSERT_EQUAL_STRING(json, monitor);

    free(monitor);
}